

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

void ON_SubD::AutomaticMeshToSubDRestoreDefaults(AutomaticMeshToSubDContext context)

{
  AutomaticMeshToSubDContext context_local;
  
  if (context != Unset) {
    if (context == Rhino5BoxModeTSpline) {
      AutomaticRhino5BoxModeTSplineToSubD = true;
      return;
    }
    if (context == FBXMeshWithDivisionLevels) {
      AutomaticFBXMeshWithDivisionLevelsToSubD = false;
      return;
    }
  }
  AutomaticFBXMeshWithDivisionLevelsToSubD = false;
  AutomaticRhino5BoxModeTSplineToSubD = true;
  return;
}

Assistant:

void ON_SubD::AutomaticMeshToSubDRestoreDefaults(
  ON_SubD::AutomaticMeshToSubDContext context
  )
{
  switch (context)
  {
  case ON_SubD::AutomaticMeshToSubDContext::Unset:
  default:
    ON_SubD::AutomaticRhino5BoxModeTSplineToSubD = ON_SubD::AutomaticRhino5BoxModeTSplineToSubDDefault;
    ON_SubD::AutomaticFBXMeshWithDivisionLevelsToSubD = ON_SubD::AutomaticFBXMeshWithDivisionLevelsToSubDDefault;
    break;
  case ON_SubD::AutomaticMeshToSubDContext::Rhino5BoxModeTSpline:
    ON_SubD::AutomaticRhino5BoxModeTSplineToSubD = ON_SubD::AutomaticRhino5BoxModeTSplineToSubDDefault;
    break;
  case ON_SubD::AutomaticMeshToSubDContext::FBXMeshWithDivisionLevels:
    ON_SubD::AutomaticFBXMeshWithDivisionLevelsToSubD = ON_SubD::AutomaticFBXMeshWithDivisionLevelsToSubDDefault;
    break;
  }
}